

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QPlatformTheme * QGenericUnixTheme::createUnixTheme(QString *name)

{
  long lVar1;
  bool bVar2;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QLatin1String *in_stack_ffffffffffffffa0;
  QLatin1String *this;
  undefined8 local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  bVar2 = ::operator==(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (bVar2) {
    local_40 = (QPlatformTheme *)operator_new(0x10);
    QGenericUnixTheme((QGenericUnixTheme *)in_stack_ffffffffffffff90);
  }
  else {
    this = in_RDI;
    QLatin1String::QLatin1String(in_RDI,(char *)in_stack_ffffffffffffff98);
    bVar2 = ::operator==(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (bVar2) {
      local_40 = QKdeTheme::createKdeTheme();
    }
    else {
      QLatin1String::QLatin1String(this,(char *)in_RDI);
      bVar2 = ::operator==((QString *)in_RDI,in_stack_ffffffffffffff90);
      if (bVar2) {
        local_40 = (QPlatformTheme *)operator_new(0x10);
        QGnomeTheme::QGnomeTheme((QGnomeTheme *)local_40);
      }
      else {
        local_40 = (QPlatformTheme *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformTheme *QGenericUnixTheme::createUnixTheme(const QString &name)
{
    if (name == QLatin1StringView(QGenericUnixTheme::name))
        return new QGenericUnixTheme;
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
    if (name == QLatin1StringView(QKdeTheme::name))
        return QKdeTheme::createKdeTheme();
#endif
    if (name == QLatin1StringView(QGnomeTheme::name))
        return new QGnomeTheme;
    return nullptr;
}